

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

GeneratedCodeInfo *
google::protobuf::DynamicCastToGenerated<google::protobuf::GeneratedCodeInfo>(Message *from)

{
  GeneratedCodeInfo *pGVar1;
  
  if (from != (Message *)0x0) {
    pGVar1 = (GeneratedCodeInfo *)
             __dynamic_cast(from,&Message::typeinfo,&GeneratedCodeInfo::typeinfo,0);
    return pGVar1;
  }
  return (GeneratedCodeInfo *)0x0;
}

Assistant:

const T* DynamicCastToGenerated(const Message* from) {
  // Compile-time assert that T is a generated type that has a
  // default_instance() accessor, but avoid actually calling it.
  const T& (*get_default_instance)() = &T::default_instance;
  (void)get_default_instance;

  // Compile-time assert that T is a subclass of google::protobuf::Message.
  const Message* unused = static_cast<T*>(nullptr);
  (void)unused;

#ifdef GOOGLE_PROTOBUF_NO_RTTI
  bool ok = T::default_instance().GetReflection() == from->GetReflection();
  return ok ? down_cast<const T*>(from) : nullptr;
#else
  return dynamic_cast<const T*>(from);
#endif
}